

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pass2_strategy.c
# Opt level: O2

double get_prediction_decay_rate(FIRSTPASS_STATS *frame_stats)

{
  double dVar1;
  double dVar2;
  double dVar3;
  
  dVar1 = get_sr_decay_rate(frame_stats);
  dVar3 = (frame_stats->pcnt_inter - frame_stats->pcnt_motion) * 0.5;
  dVar2 = 1.0;
  if ((dVar3 <= 1.0) && (dVar2 = dVar3, dVar3 < 0.0)) {
    dVar2 = 0.0;
  }
  dVar1 = (1.0 - dVar1) * dVar2 + dVar1;
  if (dVar2 <= dVar1) {
    dVar2 = dVar1;
  }
  return dVar2;
}

Assistant:

static double get_prediction_decay_rate(const FIRSTPASS_STATS *frame_stats) {
  const double sr_decay_rate = get_sr_decay_rate(frame_stats);
  double zero_motion_factor =
      DEFAULT_ZM_FACTOR * (frame_stats->pcnt_inter - frame_stats->pcnt_motion);

  // Clamp value to range 0.0 to 1.0
  // This should happen anyway if input values are sensibly clamped but checked
  // here just in case.
  if (zero_motion_factor > 1.0)
    zero_motion_factor = 1.0;
  else if (zero_motion_factor < 0.0)
    zero_motion_factor = 0.0;

  return AOMMAX(zero_motion_factor,
                (sr_decay_rate + ((1.0 - sr_decay_rate) * zero_motion_factor)));
}